

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

unsigned_long
libssh2_channel_window_write_ex(LIBSSH2_CHANNEL *channel,unsigned_long *window_size_initial)

{
  if (channel != (LIBSSH2_CHANNEL *)0x0) {
    if (window_size_initial != (unsigned_long *)0x0) {
      *window_size_initial = (ulong)(channel->local).window_size_initial;
    }
    return (ulong)(channel->local).window_size;
  }
  return 0;
}

Assistant:

LIBSSH2_API unsigned long
libssh2_channel_window_write_ex(LIBSSH2_CHANNEL *channel,
                                unsigned long *window_size_initial)
{
    if(!channel)
        return 0; /* no channel, no window! */

    if(window_size_initial) {
        /* For locally initiated channels this is very often 0, so it's not
         * *that* useful as information goes */
        *window_size_initial = channel->local.window_size_initial;
    }

    return channel->local.window_size;
}